

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFieldName_abi_cxx11_
          (FieldValuePrinter *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  string *psVar1;
  BaseTextGenerator *in_RSI;
  StringBaseTextGenerator *in_RDI;
  StringBaseTextGenerator generator;
  StringBaseTextGenerator *this_00;
  FieldDescriptor *field_00;
  Reflection *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffa8;
  FastFieldValuePrinter *in_stack_ffffffffffffffb0;
  
  field_00 = (FieldDescriptor *)&stack0xffffffffffffffb0;
  this_00 = in_RDI;
  anon_unknown_19::StringBaseTextGenerator::StringBaseTextGenerator(in_RDI);
  FastFieldValuePrinter::PrintFieldName
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,field_00,
             in_RSI);
  psVar1 = (anonymous_namespace)::StringBaseTextGenerator::Get_abi_cxx11_
                     ((StringBaseTextGenerator *)&stack0xffffffffffffffb0);
  std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  anon_unknown_19::StringBaseTextGenerator::~StringBaseTextGenerator(this_00);
  return (string *)in_RDI;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field) const {
  FORWARD_IMPL(PrintFieldName, message, reflection, field);
}